

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

void prof_butcher(CHAR_DATA *ch,char *argument)

{
  PC_DATA *pPVar1;
  ushort uVar2;
  short sVar3;
  OBJ_DATA *pOVar4;
  OBJ_INDEX_DATA *pObjIndex;
  int iVar5;
  int iVar6;
  char *txt;
  int iVar7;
  CProficiencies *pCVar8;
  int nummeat;
  int local_34;
  
  if ((*argument == '\0') || (pOVar4 = get_obj_here(ch,argument), pOVar4 == (OBJ_DATA *)0x0)) {
    txt = "You don\'t see that here.\n\r";
  }
  else if (pOVar4->item_type == 0x17) {
    if (pOVar4->contains == (OBJ_DATA *)0x0) {
      iVar7 = 0;
      act("$n butchers $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks."
          ,ch,pOVar4,(void *)0x0,0);
      act("You butcher $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks."
          ,ch,pOVar4,(void *)0x0,3);
      extract_obj(pOVar4);
      pPVar1 = ch->pcdata;
      uVar2 = CProficiencies::ProfIndexLookup("butchery");
      if (uVar2 < 0x19) {
        if (pPVar1 == (PC_DATA *)0x0) {
          pCVar8 = &prof_none;
        }
        else {
          pCVar8 = &pPVar1->profs;
        }
        iVar7 = (pCVar8->profs[uVar2] + 2) / 3;
      }
      local_34 = 1;
      if (1 < iVar7) {
        local_34 = iVar7;
      }
      iVar7 = 0;
      act("After the butchering process, you are left with $i pieces of meat.",ch,&local_34,
          (void *)0x0,3);
      if (0 < local_34) {
        do {
          pObjIndex = get_obj_index(0);
          pOVar4 = create_object(pObjIndex,(int)ch->level);
          obj_to_char(pOVar4,ch);
          pPVar1 = ch->pcdata;
          uVar2 = CProficiencies::ProfIndexLookup("butchery");
          iVar6 = -1;
          iVar5 = -1;
          if (uVar2 < 0x19) {
            if (pPVar1 == (PC_DATA *)0x0) {
              pCVar8 = &prof_none;
            }
            else {
              pCVar8 = &pPVar1->profs;
            }
            iVar5 = pCVar8->profs[uVar2];
          }
          pOVar4->value[0] = pOVar4->value[0] + iVar5;
          pPVar1 = ch->pcdata;
          uVar2 = CProficiencies::ProfIndexLookup("butchery");
          if (uVar2 < 0x19) {
            if (pPVar1 == (PC_DATA *)0x0) {
              pCVar8 = &prof_none;
            }
            else {
              pCVar8 = &pPVar1->profs;
            }
            iVar6 = pCVar8->profs[uVar2];
          }
          pOVar4->value[1] = pOVar4->value[1] + iVar6;
          pPVar1 = ch->pcdata;
          uVar2 = CProficiencies::ProfIndexLookup("butchery");
          sVar3 = 10;
          if (uVar2 < 0x19) {
            if (pPVar1 == (PC_DATA *)0x0) {
              pCVar8 = &prof_none;
            }
            else {
              pCVar8 = &pPVar1->profs;
            }
            sVar3 = (short)pCVar8->profs[uVar2] * 2 + 0xc;
          }
          pOVar4->timer = sVar3;
          iVar7 = iVar7 + 1;
        } while (iVar7 < local_34);
      }
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar8 = &prof_none;
      }
      else {
        pCVar8 = &ch->pcdata->profs;
      }
      sVar3 = CProficiencies::ProfIndexLookup("butchery");
      CProficiencies::CheckImprove(pCVar8,(int)sVar3,100);
      WAIT_STATE(ch,0xc);
      return;
    }
    txt = "That corpse is too full to be gutted.\n\r";
  }
  else {
    txt = "You can\'t butcher that.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void prof_butcher(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;

	if (argument[0] == '\0' || !(obj = get_obj_here(ch, argument)))
	{
		send_to_char("You don't see that here.\n\r",ch);
		return;
	}

	if (obj->item_type != ITEM_CORPSE_NPC)
	{
		send_to_char("You can't butcher that.\n\r", ch);
		return;
	}

	if (obj->contains)
	{
		send_to_char("That corpse is too full to be gutted.\n\r", ch);
		return;
	}

	act("$n butchers $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks.", ch, obj, 0, TO_ROOM);
	act("You butcher $p, carefully gutting it, extracting the edible portions and slicing them into rough chunks.", ch, obj, 0, TO_CHAR);

	extract_obj(obj);

	int nummeat = std::max(1, (ch->Profs()->GetProf("butchery") + 2) / 3);
	act("After the butchering process, you are left with $i pieces of meat.", ch, &nummeat, 0, TO_CHAR);

	for (auto i = 0; i < nummeat; i++)
	{
		auto meat = create_object(get_obj_index(OBJ_VNUM_MEAT_CHUNKS), ch->level);
		obj_to_char(meat, ch);
		meat->value[0] += ch->Profs()->GetProf("butchery");
		meat->value[1] += ch->Profs()->GetProf("butchery");
		meat->timer = 12 + ch->Profs()->GetProf("butchery") * 2;
	}

	ch->Profs()->CheckImprove("butchery", 100);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}